

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTPNTargetprop::gen_code(CTPNTargetprop *this,int discard,int param_3)

{
  int iVar1;
  size_t in_RCX;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  int in_ESI;
  uchar in_stack_000000df;
  CTcGenTarg *in_stack_000000e0;
  
  iVar1 = CTcCodeStream::is_self_available(G_cs);
  if (iVar1 == 0) {
    CTcTokenizer::log_error(0x2d1e);
  }
  if (in_ESI == 0) {
    CTcGenTarg::write_op(in_stack_000000e0,in_stack_000000df);
    CTcDataStream::write
              (&G_cs->super_CTcDataStream,1,(void *)CONCAT44(extraout_var,extraout_EDX),in_RCX);
    CTcGenTarg::note_push((CTcGenTarg *)0x2cfeef);
  }
  return;
}

Assistant:

void CTPNTargetprop::gen_code(int discard, int)
{
    /* it's an error if we're not in a method context */
    if (!G_cs->is_self_available())
        G_tok->log_error(TCERR_TARGETPROP_NOT_AVAIL);

    /* if we're not discarding the result, push the target property ID */
    if (!discard)
    {
        G_cg->write_op(OPC_PUSHCTXELE);
        G_cs->write(PUSHCTXELE_TARGPROP);
        G_cg->note_push();
    }
}